

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_between_expression.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,BetweenExpression *expr,
          idx_t depth)

{
  ClientContext *pCVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  type pPVar5;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_02;
  type pEVar6;
  CollationBinding *pCVar7;
  pointer pEVar8;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var9;
  BoundComparisonExpression *this_03;
  BoundConjunctionExpression *this_04;
  BinderException *pBVar10;
  LogicalType input_type;
  LogicalType upper_sql_type;
  LogicalType lower_sql_type;
  LogicalType input_sql_type;
  ErrorData error;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_270;
  undefined1 local_268 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  optional_idx local_238;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_230;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_228;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_220;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_218;
  LogicalType local_210;
  LogicalType local_1f8;
  LogicalType local_1e0;
  LogicalType local_1c8;
  undefined1 local_1b0 [128];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [128];
  
  local_248._8_8_ = __return_storage_ptr__;
  ErrorData::ErrorData((ErrorData *)local_1b0);
  BindChild(this,&expr->input,depth,(ErrorData *)local_1b0);
  BindChild(this,&expr->lower,depth,(ErrorData *)local_1b0);
  BindChild(this,&expr->upper,depth,(ErrorData *)local_1b0);
  if (local_1b0[0] == true) {
    local_b0._0_2_ = local_1b0._0_2_;
    if ((undefined1 *)local_1b0._8_8_ == local_1b0 + 0x18) {
      local_b0._32_4_ = local_1b0._32_4_;
      local_b0._36_4_ = local_1b0._36_4_;
      local_b0._8_8_ = local_b0 + 0x18;
    }
    else {
      local_b0._8_8_ = local_1b0._8_8_;
    }
    local_b0._16_8_ = local_1b0._16_8_;
    local_1b0._16_8_ = 0;
    local_1b0._24_4_ = local_1b0._24_4_ & 0xffffff00;
    if ((undefined1 *)local_1b0._40_8_ == local_1b0 + 0x38) {
      local_b0._64_4_ = local_1b0._64_4_;
      local_b0._68_4_ = local_1b0._68_4_;
      local_b0._40_8_ = local_b0 + 0x38;
    }
    else {
      local_b0._40_8_ = local_1b0._40_8_;
    }
    local_b0._48_8_ = local_1b0._48_8_;
    local_1b0._48_8_ = 0;
    local_1b0._56_4_ = local_1b0._56_4_ & 0xffffff00;
    local_1b0._8_8_ = local_1b0 + 0x18;
    local_1b0._40_8_ = local_1b0 + 0x38;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_b0 + 0x48),local_1b0 + 0x48);
    BindResult::BindResult((BindResult *)local_248._8_8_,(ErrorData *)local_b0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_b0 + 0x48));
    if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
      operator_delete((void *)local_b0._40_8_);
    }
    if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
      operator_delete((void *)local_b0._8_8_);
    }
    goto LAB_0119c071;
  }
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&expr->input);
  this_00 = BoundExpression::GetExpression(pPVar5);
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&expr->lower);
  this_01 = BoundExpression::GetExpression(pPVar5);
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(&expr->upper);
  this_02 = BoundExpression::GetExpression(pPVar5);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this_00);
  GetExpressionReturnType(&local_1c8,pEVar6);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this_01);
  GetExpressionReturnType(&local_1e0,pEVar6);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this_02);
  GetExpressionReturnType(&local_1f8,pEVar6);
  LogicalType::LogicalType(&local_210);
  bVar3 = BoundComparisonExpression::TryBindComparison
                    (this->context,&local_1c8,&local_1e0,&local_210,
                     (expr->super_ParsedExpression).super_BaseExpression.type);
  if (!bVar3) {
    pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
    local_268._0_8_ = (long)local_268 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_268,
               "Cannot mix values of type %s and %s in BETWEEN clause - an explicit cast is required"
               ,"");
    LogicalType::ToString_abi_cxx11_(&local_d0,&local_1c8);
    LogicalType::ToString_abi_cxx11_(&local_f0,&local_1e0);
    BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
              (pBVar10,&expr->super_ParsedExpression,(string *)local_268,&local_d0,&local_f0);
    __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar3 = BoundComparisonExpression::TryBindComparison
                    (this->context,&local_210,&local_1f8,&local_210,
                     (expr->super_ParsedExpression).super_BaseExpression.type);
  if (!bVar3) {
    pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
    local_268._0_8_ = (long)local_268 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_268,
               "Cannot mix values of type %s and %s in BETWEEN clause - an explicit cast is required"
               ,"");
    LogicalType::ToString_abi_cxx11_(&local_110,&local_210);
    LogicalType::ToString_abi_cxx11_(&local_130,&local_1f8);
    BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
              (pBVar10,&expr->super_ParsedExpression,(string *)local_268,&local_110,&local_130);
    __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar1 = this->context;
  local_218._M_head_impl =
       (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddCastToType
            ((BoundCastExpression *)local_268,pCVar1,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_218,&local_210,false);
  uVar2 = local_268._0_8_;
  local_268._0_8_ = (Expression *)0x0;
  _Var9._M_head_impl =
       (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar2;
  if (_Var9._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
      local_268._0_8_ != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_268._0_8_ + 8))();
  }
  local_268._0_8_ =
       (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  if (local_218._M_head_impl != (Expression *)0x0) {
    (*((local_218._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_218._M_head_impl = (Expression *)0x0;
  pCVar1 = this->context;
  local_220._M_head_impl =
       (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddCastToType
            ((BoundCastExpression *)local_268,pCVar1,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_220,&local_210,false);
  uVar2 = local_268._0_8_;
  local_268._0_8_ = (Expression *)0x0;
  _Var9._M_head_impl =
       (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar2;
  if (_Var9._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
      local_268._0_8_ != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_268._0_8_ + 8))();
  }
  local_268._0_8_ =
       (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  if (local_220._M_head_impl != (Expression *)0x0) {
    (*((local_220._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_220._M_head_impl = (Expression *)0x0;
  pCVar1 = this->context;
  local_228._M_head_impl =
       (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddCastToType
            ((BoundCastExpression *)local_268,pCVar1,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_228,&local_210,false);
  uVar2 = local_268._0_8_;
  local_268._0_8_ = (Expression *)0x0;
  _Var9._M_head_impl =
       (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar2;
  if (_Var9._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
      local_268._0_8_ != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_268._0_8_ + 8))();
  }
  local_268._0_8_ =
       (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  if (local_228._M_head_impl != (Expression *)0x0) {
    (*((local_228._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_228._M_head_impl = (Expression *)0x0;
  pCVar1 = this->context;
  pCVar7 = CollationBinding::Get(pCVar1);
  CollationBinding::PushCollation(pCVar7,pCVar1,this_00,&local_210,ALL_COLLATIONS);
  pCVar1 = this->context;
  pCVar7 = CollationBinding::Get(pCVar1);
  CollationBinding::PushCollation(pCVar7,pCVar1,this_01,&local_210,ALL_COLLATIONS);
  pCVar1 = this->context;
  pCVar7 = CollationBinding::Get(pCVar1);
  CollationBinding::PushCollation(pCVar7,pCVar1,this_02,&local_210,ALL_COLLATIONS);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  iVar4 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar8);
  if ((char)iVar4 == '\0') {
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    iVar4 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[6])(pEVar8);
    if ((char)iVar4 != '\0') goto LAB_0119befd;
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    iVar4 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[4])(pEVar8);
    if ((char)iVar4 != '\0') goto LAB_0119befd;
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])(local_268 + 0x20,pEVar8);
    _Var9._M_head_impl = (Expression *)operator_new(0x68);
    local_268._0_8_ = local_248._M_allocated_capacity;
    local_248._M_allocated_capacity = 0;
    local_270._M_head_impl =
         (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this_01->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundComparisonExpression::BoundComparisonExpression
              ((BoundComparisonExpression *)_Var9._M_head_impl,COMPARE_GREATERTHANOREQUALTO,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_268,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_270);
    if (local_270._M_head_impl != (Expression *)0x0) {
      (*((local_270._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_270._M_head_impl = (Expression *)0x0;
    if ((Expression *)local_268._0_8_ != (Expression *)0x0) {
      (**(code **)(*(_func_int **)local_268._0_8_ + 8))();
    }
    if ((_func_int **)local_248._M_allocated_capacity != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_248._M_allocated_capacity + 8))();
    }
    this_03 = (BoundComparisonExpression *)operator_new(0x68);
    local_268._0_8_ =
         (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    local_270._M_head_impl =
         (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this_02->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundComparisonExpression::BoundComparisonExpression
              (this_03,COMPARE_LESSTHANOREQUALTO,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_268,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_270);
    if (local_270._M_head_impl != (Expression *)0x0) {
      (*((local_270._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_270._M_head_impl = (Expression *)0x0;
    if ((Expression *)local_268._0_8_ != (Expression *)0x0) {
      (*((BaseExpression *)local_268._0_8_)->_vptr_BaseExpression[1])();
    }
    this_04 = (BoundConjunctionExpression *)operator_new(0x70);
    local_270._M_head_impl = (Expression *)this_03;
    local_268._0_8_ = _Var9._M_head_impl;
    BoundConjunctionExpression::BoundConjunctionExpression
              (this_04,CONJUNCTION_AND,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_268,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_270);
    if ((BoundComparisonExpression *)local_270._M_head_impl != (BoundComparisonExpression *)0x0) {
      (*(((Expression *)&(local_270._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    local_270._M_head_impl = (Expression *)0x0;
    if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
        local_268._0_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_268._0_8_ + 8))();
    }
    local_230._M_head_impl = (Expression *)this_04;
    BindResult::BindResult
              ((BindResult *)local_248._8_8_,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_230);
    if ((BoundConjunctionExpression *)local_230._M_head_impl != (BoundConjunctionExpression *)0x0) {
      (*(((Expression *)&(local_230._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    local_230._M_head_impl = (Expression *)0x0;
  }
  else {
LAB_0119befd:
    local_270._M_head_impl._0_1_ = 1;
    local_248._M_local_buf[0] = 1;
    make_uniq<duckdb::BoundBetweenExpression,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,bool,bool>
              ((duckdb *)local_268,this_00,this_01,this_02,(bool *)&local_270,
               (bool *)(local_268 + 0x20));
    local_238.index = local_268._0_8_;
    local_268._0_8_ =
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    BindResult::BindResult
              ((BindResult *)local_248._8_8_,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               (local_268 + 0x30));
    if ((_func_int **)local_238.index != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_238.index + 8))();
    }
    local_238.index = 0;
    if ((Expression *)local_268._0_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_268._0_8_ + 8))();
    }
  }
  LogicalType::~LogicalType(&local_210);
  LogicalType::~LogicalType(&local_1f8);
  LogicalType::~LogicalType(&local_1e0);
  LogicalType::~LogicalType(&local_1c8);
LAB_0119c071:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_1b0 + 0x48));
  if ((undefined1 *)local_1b0._40_8_ != local_1b0 + 0x38) {
    operator_delete((void *)local_1b0._40_8_);
  }
  if ((undefined1 *)local_1b0._8_8_ != local_1b0 + 0x18) {
    operator_delete((void *)local_1b0._8_8_);
  }
  return (BindResult *)local_248._8_8_;
}

Assistant:

BindResult ExpressionBinder::BindExpression(BetweenExpression &expr, idx_t depth) {
	// first try to bind the children of the case expression
	ErrorData error;
	BindChild(expr.input, depth, error);
	BindChild(expr.lower, depth, error);
	BindChild(expr.upper, depth, error);
	if (error.HasError()) {
		return BindResult(std::move(error));
	}
	// the children have been successfully resolved
	auto &input = BoundExpression::GetExpression(*expr.input);
	auto &lower = BoundExpression::GetExpression(*expr.lower);
	auto &upper = BoundExpression::GetExpression(*expr.upper);

	auto input_sql_type = ExpressionBinder::GetExpressionReturnType(*input);
	auto lower_sql_type = ExpressionBinder::GetExpressionReturnType(*lower);
	auto upper_sql_type = ExpressionBinder::GetExpressionReturnType(*upper);

	// cast the input types to the same type
	// now obtain the result type of the input types
	LogicalType input_type;
	if (!BoundComparisonExpression::TryBindComparison(context, input_sql_type, lower_sql_type, input_type,
	                                                  expr.GetExpressionType())) {

		throw BinderException(expr,
		                      "Cannot mix values of type %s and %s in BETWEEN clause - an explicit cast is required",
		                      input_sql_type.ToString(), lower_sql_type.ToString());
	}
	if (!BoundComparisonExpression::TryBindComparison(context, input_type, upper_sql_type, input_type,
	                                                  expr.GetExpressionType())) {
		throw BinderException(expr,
		                      "Cannot mix values of type %s and %s in BETWEEN clause - an explicit cast is required",
		                      input_type.ToString(), upper_sql_type.ToString());
	}
	// add casts (if necessary)
	input = BoundCastExpression::AddCastToType(context, std::move(input), input_type);
	lower = BoundCastExpression::AddCastToType(context, std::move(lower), input_type);
	upper = BoundCastExpression::AddCastToType(context, std::move(upper), input_type);
	// handle collation
	PushCollation(context, input, input_type);
	PushCollation(context, lower, input_type);
	PushCollation(context, upper, input_type);

	if (!input->IsVolatile() && !input->HasParameter() && !input->HasSubquery()) {
		// the expression does not have side effects and can be copied: create two comparisons
		// the reason we do this is that individual comparisons are easier to handle in optimizers
		// if both comparisons remain they will be folded together again into a single BETWEEN in the optimizer
		auto left_compare = make_uniq<BoundComparisonExpression>(ExpressionType::COMPARE_GREATERTHANOREQUALTO,
		                                                         input->Copy(), std::move(lower));
		auto right_compare = make_uniq<BoundComparisonExpression>(ExpressionType::COMPARE_LESSTHANOREQUALTO,
		                                                          std::move(input), std::move(upper));
		return BindResult(make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND,
		                                                        std::move(left_compare), std::move(right_compare)));
	} else {
		// expression has side effects: we cannot duplicate it
		// create a bound_between directly
		return BindResult(
		    make_uniq<BoundBetweenExpression>(std::move(input), std::move(lower), std::move(upper), true, true));
	}
}